

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glReadPixels
          (QOpenGLFunctions *this,GLint x,GLint y,GLsizei width,GLsizei height,GLenum format,
          GLenum type,GLvoid *pixels)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  
  (**(code **)(*in_RDI + 0x118))
            (in_ESI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,CONCAT44(width,height));
  return;
}

Assistant:

inline void QOpenGLFunctions::glReadPixels(GLint x, GLint y, GLsizei width, GLsizei height, GLenum format, GLenum type, GLvoid* pixels)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glReadPixels(x, y, width, height, format, type, pixels);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.ReadPixels(x, y, width, height, format, type, pixels);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}